

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

int send_flow(SESSION_INSTANCE *session)

{
  int iVar1;
  FLOW_HANDLE flow_00;
  AMQP_VALUE performative;
  AMQP_VALUE flow_performative_value;
  FLOW_HANDLE flow;
  int result;
  SESSION_INSTANCE *session_local;
  
  if (session == (SESSION_INSTANCE *)0x0) {
    flow._4_4_ = 0x114;
  }
  else {
    flow_00 = flow_create(session->incoming_window,session->next_outgoing_id,
                          session->outgoing_window);
    if (flow_00 == (FLOW_HANDLE)0x0) {
      flow._4_4_ = 0x11c;
    }
    else {
      iVar1 = flow_set_next_incoming_id(flow_00,session->next_incoming_id);
      if (iVar1 == 0) {
        performative = amqpvalue_create_flow(flow_00);
        if (performative == (AMQP_VALUE)0x0) {
          flow._4_4_ = 0x129;
        }
        else {
          iVar1 = connection_encode_frame
                            (session->endpoint,performative,(PAYLOAD *)0x0,0,(ON_SEND_COMPLETE)0x0,
                             (void *)0x0);
          if (iVar1 == 0) {
            flow._4_4_ = 0;
          }
          else {
            flow._4_4_ = 0x12f;
          }
          amqpvalue_destroy(performative);
        }
      }
      else {
        flow._4_4_ = 0x122;
      }
      flow_destroy(flow_00);
    }
  }
  return flow._4_4_;
}

Assistant:

static int send_flow(SESSION_INSTANCE* session)
{
    int result;
    if (session == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        FLOW_HANDLE flow = flow_create(session->incoming_window, session->next_outgoing_id, session->outgoing_window);

        if (flow == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (flow_set_next_incoming_id(flow, session->next_incoming_id) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE flow_performative_value = amqpvalue_create_flow(flow);
                if (flow_performative_value == NULL)
                {
                    result = MU_FAILURE;
                }
                else
                {
                    if (connection_encode_frame(session->endpoint, flow_performative_value, NULL, 0, NULL, NULL) != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }

                    amqpvalue_destroy(flow_performative_value);
                }
            }

            flow_destroy(flow);
        }
    }

    return result;
}